

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_write_real(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  uint uVar1;
  uint uVar2;
  int line;
  size_t __n;
  char *text;
  ulong uVar3;
  
  uVar1 = *(uint *)&ssl->conf->field_0x164;
  uVar2 = *(uint *)((long)mfl_code_to_length + (ulong)(uVar1 >> 5 & 0x1c));
  if ((ssl->session_out != (mbedtls_ssl_session *)0x0) &&
     (mfl_code_to_length[ssl->session_out->mfl_code] < uVar2)) {
    uVar2 = mfl_code_to_length[ssl->session_out->mfl_code];
  }
  uVar3 = (ulong)uVar2;
  __n = len;
  if ((uVar3 < len) && (__n = uVar3, (uVar1 & 2) != 0)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x19e5,"fragment larger than the (negotiated) maximum fragment length: %d > %d",len,
               uVar3);
    __n = 0xffff8f00;
  }
  else {
    if (ssl->out_left == 0) {
      ssl->out_msglen = __n;
      ssl->out_msgtype = 0x17;
      memcpy(ssl->out_msg,buf,__n);
      uVar1 = mbedtls_ssl_write_record(ssl);
      if (uVar1 == 0) goto LAB_0013b571;
      text = "mbedtls_ssl_write_record";
      line = 0x19fe;
    }
    else {
      uVar1 = mbedtls_ssl_flush_output(ssl);
      if (uVar1 == 0) goto LAB_0013b571;
      text = "mbedtls_ssl_flush_output";
      line = 0x19f2;
    }
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,line,text,uVar1);
    __n = (size_t)uVar1;
  }
LAB_0013b571:
  return (int)__n;
}

Assistant:

static int ssl_write_real( mbedtls_ssl_context *ssl,
                           const unsigned char *buf, size_t len )
{
    int ret;
#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    size_t max_len = mbedtls_ssl_get_max_frag_len( ssl );

    if( len > max_len )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "fragment larger than the (negotiated) "
                                "maximum fragment length: %d > %d",
                                len, max_len ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }
        else
#endif
            len = max_len;
    }
#endif /* MBEDTLS_SSL_MAX_FRAGMENT_LENGTH */

    if( ssl->out_left != 0 )
    {
        if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
            return( ret );
        }
    }
    else
    {
        ssl->out_msglen  = len;
        ssl->out_msgtype = MBEDTLS_SSL_MSG_APPLICATION_DATA;
        memcpy( ssl->out_msg, buf, len );

        if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
            return( ret );
        }
    }

    return( (int) len );
}